

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

void __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
iterator(iterator *this,
        olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *tree)

{
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *tree_local;
  iterator *this_local;
  
  this->db_ = tree;
  std::
  stack<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry,std::deque<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry,std::allocator<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>>>
  ::
  stack<std::deque<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry,std::allocator<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>>,void>
            ((stack<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry,std::deque<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry,std::allocator<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>>>
              *)&this->stack_);
  memset(&this->keybuf_,0,0x118);
  detail::key_buffer::key_buffer(&this->keybuf_);
  return;
}

Assistant:

explicit iterator(olc_db& tree) noexcept : db_(tree) {}